

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIrrDeviceSDL.cpp
# Opt level: O0

void __thiscall irr::CIrrDeviceSDL::~CIrrDeviceSDL(CIrrDeviceSDL *this)

{
  CIrrDeviceSDL *in_stack_00000010;
  
  ~CIrrDeviceSDL(in_stack_00000010);
  return;
}

Assistant:

CIrrDeviceSDL::~CIrrDeviceSDL()
{
	if (--SDLDeviceInstances == 0) {
#if defined(_IRR_COMPILE_WITH_JOYSTICK_EVENTS_)
		const u32 numJoysticks = Joysticks.size();
		for (u32 i = 0; i < numJoysticks; ++i)
			SDL_JoystickClose(Joysticks[i]);
#endif
		if (Window) {
			SDL_GL_MakeCurrent(Window, NULL);
			SDL_GL_DeleteContext(Context);
			SDL_DestroyWindow(Window);
		}
		SDL_Quit();

		os::Printer::log("Quit SDL", ELL_INFORMATION);
	}
}